

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  _func_void_void_ptr_sqlite3_ptr_int_void_ptr *p_Var4;
  sqlite3_vfs *psVar5;
  Select *pSVar6;
  SrcList *pSVar7;
  ExprList *pEVar8;
  byte bVar9;
  int iVar10;
  SrcItem *pSVar11;
  Select *pSVar12;
  Expr *pEVar13;
  int in_ECX;
  u32 uVar14;
  int in_EDX;
  Select *in_RSI;
  sqlite3 *in_RDI;
  long in_FS_OFFSET;
  ExprList *pOrderBy_1;
  SrcItem *pItem;
  u8 ltorj;
  u8 jointype;
  int nSubSrc;
  Parse *pToplevel;
  Table *pTabToDel;
  Table *pItemTab;
  Select *pPrior;
  Expr *pLimit;
  ExprList *pOrderBy;
  Select *pNew;
  int ii;
  int *aCsrMap;
  sqlite3 *db;
  SrcItem *pSubitem;
  Expr *pWhere;
  int i;
  int isOuterJoin;
  int iNewParent;
  int iParent;
  SrcList *pSubSrc;
  SrcList *pSrc;
  Select *pSub1;
  Select *pSub;
  Select *pParent;
  char *zSavedAuthContext;
  SubstContext x;
  Walker w;
  u32 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  sqlite3 *in_stack_fffffffffffffec0;
  Parse *in_stack_fffffffffffffec8;
  Parse *in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffeda;
  undefined1 in_stack_fffffffffffffedb;
  byte bVar15;
  undefined4 in_stack_fffffffffffffedc;
  sqlite3 *in_stack_fffffffffffffee0;
  Parse *in_stack_fffffffffffffee8;
  sqlite3 *db_00;
  int local_e4;
  undefined4 *local_e0;
  int local_c0;
  int local_bc;
  SrcList *local_a8;
  Select *local_a0;
  Select *local_98;
  Select *local_90;
  int local_64;
  undefined1 local_60 [8];
  int local_58;
  int local_54;
  int local_50;
  ExprList *local_48;
  ExprList *local_40;
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = in_RDI->xCollNeeded16;
  local_bc = 0;
  psVar5 = in_RDI->pVfs;
  memset(local_38,0xaa,0x30);
  local_e0 = (undefined4 *)0x0;
  if (((ulong)psVar5->xDlClose & 1) == 0) {
    local_a8 = in_RSI->pSrc;
    pSVar11 = local_a8->a + in_EDX;
    iVar2 = pSVar11->iCursor;
    pSVar6 = ((pSVar11->u4).pSubq)->pSelect;
    if ((in_RSI->pWin == (Window *)0x0) && (pSVar6->pWin == (Window *)0x0)) {
      pSVar7 = pSVar6->pSrc;
      if ((pSVar6->pLimit == (Expr *)0x0) || (in_RSI->pLimit == (Expr *)0x0)) {
        if ((pSVar6->pLimit == (Expr *)0x0) || (pSVar6->pLimit->pRight == (Expr *)0x0)) {
          if (((in_RSI->selFlags & 0x100) == 0) || (pSVar6->pLimit == (Expr *)0x0)) {
            if (pSVar7->nSrc == 0) {
              local_64 = 0;
            }
            else if ((pSVar6->selFlags & 1) == 0) {
              if ((pSVar6->pLimit == (Expr *)0x0) || ((local_a8->nSrc < 2 && (in_ECX == 0)))) {
                if ((in_RSI->pOrderBy == (ExprList *)0x0) || (pSVar6->pOrderBy == (ExprList *)0x0))
                {
                  if ((in_ECX == 0) || (pSVar6->pOrderBy == (ExprList *)0x0)) {
                    if ((pSVar6->pLimit == (Expr *)0x0) || (in_RSI->pWhere == (Expr *)0x0)) {
                      if ((pSVar6->pLimit == (Expr *)0x0) || ((in_RSI->selFlags & 1) == 0)) {
                        if ((pSVar6->selFlags & 0x2000) == 0) {
                          if (((pSVar11->fg).jointype & 0x60) != 0) {
                            if ((((1 < pSVar7->nSrc) || ((pSVar7->a[0].pSTab)->eTabType == '\x01'))
                                || ((in_RSI->selFlags & 1) != 0)) ||
                               (((pSVar11->fg).jointype & 0x10) != 0)) {
                              local_64 = 0;
                              goto LAB_001e8001;
                            }
                            local_bc = 1;
                          }
                          if ((in_EDX < 1) || ((pSVar7->a[0].fg.jointype & 0x40) == 0)) {
                            if (pSVar6->pPrior != (Select *)0x0) {
                              if (pSVar6->pOrderBy != (ExprList *)0x0) {
                                local_64 = 0;
                                goto LAB_001e8001;
                              }
                              if (((in_ECX != 0) || ((in_RSI->selFlags & 1) != 0)) ||
                                 (local_a0 = pSVar6, local_bc != 0)) {
                                local_64 = 0;
                                goto LAB_001e8001;
                              }
                              for (; local_a0 != (Select *)0x0; local_a0 = local_a0->pPrior) {
                                if ((((local_a0->selFlags & 9) != 0) ||
                                    (((local_a0->pPrior != (Select *)0x0 && (local_a0->op != 0x88))
                                     || (local_a0->pSrc->nSrc < 1)))) ||
                                   (local_a0->pWin != (Window *)0x0)) {
                                  local_64 = 0;
                                  goto LAB_001e8001;
                                }
                                if ((0 < in_EDX) && ((local_a0->pSrc->a[0].fg.jointype & 0x40) != 0)
                                   ) {
                                  local_64 = 0;
                                  goto LAB_001e8001;
                                }
                              }
                              if (in_RSI->pOrderBy != (ExprList *)0x0) {
                                for (local_e4 = 0; local_e4 < in_RSI->pOrderBy->nExpr;
                                    local_e4 = local_e4 + 1) {
                                  if (in_RSI->pOrderBy->a[local_e4].u.x.iOrderByCol == 0) {
                                    local_64 = 0;
                                    goto LAB_001e8001;
                                  }
                                }
                              }
                              if ((in_RSI->selFlags & 0x2000) != 0) {
                                local_64 = 0;
                                goto LAB_001e8001;
                              }
                              iVar10 = compoundHasDifferentAffinities
                                                 ((Select *)
                                                  CONCAT44(in_stack_fffffffffffffedc,
                                                           CONCAT13(in_stack_fffffffffffffedb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeda,
                                                  in_stack_fffffffffffffed8))));
                              if (iVar10 != 0) {
                                local_64 = 0;
                                goto LAB_001e8001;
                              }
                              if (1 < local_a8->nSrc) {
                                if (500 < in_RDI->aLimit[3]) {
                                  local_64 = 0;
                                  goto LAB_001e8001;
                                }
                                if (((ulong)psVar5->xDlClose & 0x800000) != 0) {
                                  local_64 = 0;
                                  goto LAB_001e8001;
                                }
                                local_e0 = (undefined4 *)
                                           sqlite3DbMallocZero(in_stack_fffffffffffffec0,
                                                               CONCAT44(in_stack_fffffffffffffebc,
                                                                        in_stack_fffffffffffffeb8));
                                if (local_e0 != (undefined4 *)0x0) {
                                  *local_e0 = (int)in_RDI->lastRowid;
                                }
                              }
                            }
                            in_RDI->xCollNeeded16 =
                                 (_func_void_void_ptr_sqlite3_ptr_int_void_ptr *)pSVar11->zName;
                            sqlite3AuthCheck(in_stack_fffffffffffffee8,
                                             (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                             (char *)CONCAT44(in_stack_fffffffffffffedc,
                                                              CONCAT13(in_stack_fffffffffffffedb,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffeda,
                                                  in_stack_fffffffffffffed8))),
                                             (char *)in_stack_fffffffffffffed0,
                                             (char *)in_stack_fffffffffffffec8);
                            in_RDI->xCollNeeded16 = p_Var4;
                            if ((*(ushort *)&(pSVar11->fg).field_0x1 >> 2 & 1) == 0) {
                              local_a0 = (Select *)0x0;
                            }
                            else {
                              local_a0 = sqlite3SubqueryDetach
                                                   (in_stack_fffffffffffffec0,
                                                    (SrcItem *)
                                                    CONCAT44(in_stack_fffffffffffffebc,
                                                             in_stack_fffffffffffffeb8));
                            }
                            sqlite3DbFree(in_stack_fffffffffffffec0,
                                          (void *)CONCAT44(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8));
                            sqlite3DbFree(in_stack_fffffffffffffec0,
                                          (void *)CONCAT44(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8));
                            pSVar11->zName = (char *)0x0;
                            pSVar11->zAlias = (char *)0x0;
                            for (local_98 = pSVar6->pPrior; local_98 != (Select *)0x0;
                                local_98 = local_98->pPrior) {
                              pEVar8 = in_RSI->pOrderBy;
                              pEVar13 = in_RSI->pLimit;
                              pSVar6 = in_RSI->pPrior;
                              db_00 = (sqlite3 *)pSVar11->pSTab;
                              pSVar11->pSTab = (Table *)0x0;
                              in_RSI->pOrderBy = (ExprList *)0x0;
                              in_RSI->pPrior = (Select *)0x0;
                              in_RSI->pLimit = (Expr *)0x0;
                              pSVar12 = sqlite3SelectDup(db_00,(Select *)in_stack_fffffffffffffee8,
                                                         (int)((ulong)in_stack_fffffffffffffee0 >>
                                                              0x20));
                              in_RSI->pLimit = pEVar13;
                              in_RSI->pOrderBy = pEVar8;
                              in_RSI->op = 0x88;
                              pSVar11->pSTab = (Table *)db_00;
                              if (pSVar12 == (Select *)0x0) {
                                in_RSI->pPrior = pSVar6;
                              }
                              else {
                                uVar14 = in_RDI->aLimit[3] + 1;
                                in_RDI->aLimit[3] = uVar14;
                                pSVar12->selId = uVar14;
                                if ((local_e0 != (undefined4 *)0x0) &&
                                   (*(char *)((long)&psVar5->xDlClose + 7) == '\0')) {
                                  renumberCursors(in_stack_fffffffffffffec8,
                                                  (Select *)in_stack_fffffffffffffec0,
                                                  in_stack_fffffffffffffebc,(int *)0x1e7940);
                                }
                                pSVar12->pPrior = pSVar6;
                                if (pSVar6 != (Select *)0x0) {
                                  pSVar6->pNext = pSVar12;
                                }
                                pSVar12->pNext = in_RSI;
                                in_RSI->pPrior = pSVar12;
                              }
                            }
                            sqlite3DbFree(in_stack_fffffffffffffec0,
                                          (void *)CONCAT44(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8));
                            if (*(char *)((long)&psVar5->xDlClose + 7) == '\0') {
                              if (pSVar11->pSTab != (Table *)0x0) {
                                in_stack_fffffffffffffee8 = (Parse *)pSVar11->pSTab;
                                if (in_stack_fffffffffffffee8->nRangeReg == 1) {
                                  in_stack_fffffffffffffec0 = in_RDI;
                                  if (*(long *)(in_RDI->aLimit + 10) != 0) {
                                    in_stack_fffffffffffffec0 = *(sqlite3 **)(in_RDI->aLimit + 10);
                                  }
                                  in_stack_fffffffffffffee0 = in_stack_fffffffffffffec0;
                                  sqlite3ParserAddCleanup
                                            (in_stack_fffffffffffffed0,
                                             (_func_void_sqlite3_ptr_void_ptr *)
                                             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
                                }
                                else {
                                  in_stack_fffffffffffffee8->nRangeReg =
                                       in_stack_fffffffffffffee8->nRangeReg - 1;
                                }
                                pSVar11->pSTab = (Table *)0x0;
                              }
                              local_98 = local_a0;
                              for (local_90 = in_RSI; local_90 != (Select *)0x0;
                                  local_90 = local_90->pPrior) {
                                bVar15 = 0;
                                bVar1 = local_a8->a[in_EDX].fg.jointype;
                                bVar9 = bVar1 & 0x40;
                                pSVar7 = local_98->pSrc;
                                iVar10 = pSVar7->nSrc;
                                local_a8 = local_90->pSrc;
                                if (local_90 == in_RSI) {
                                  bVar15 = (pSVar11->fg).jointype;
                                }
                                if (1 < iVar10) {
                                  local_a8 = sqlite3SrcListEnlarge
                                                       (in_stack_fffffffffffffee8,
                                                        (SrcList *)in_stack_fffffffffffffee0,iVar10,
                                                        CONCAT13(bVar15,CONCAT12(bVar1,
                                                  in_stack_fffffffffffffed8)) & 0xff40ffff);
                                  if (local_a8 == (SrcList *)0x0) break;
                                  local_90->pSrc = local_a8;
                                }
                                iVar3 = pSVar7->a[0].iCursor;
                                for (local_c0 = 0; local_c0 < iVar10; local_c0 = local_c0 + 1) {
                                  in_stack_fffffffffffffed0 =
                                       (Parse *)(local_a8->a + (local_c0 + in_EDX));
                                  if ((*(ushort *)
                                        &((anon_struct_4_19_bb8b771d_for_fg *)
                                         &in_stack_fffffffffffffed0->rc)->field_0x1 >> 0xb & 1) != 0
                                     ) {
                                    sqlite3IdListDelete(in_stack_fffffffffffffec0,
                                                        (IdList *)
                                                        CONCAT44(in_stack_fffffffffffffebc,
                                                                 in_stack_fffffffffffffeb8));
                                  }
                                  memcpy(in_stack_fffffffffffffed0,pSVar7->a + local_c0,0x48);
                                  ((anon_struct_4_19_bb8b771d_for_fg *)
                                  &in_stack_fffffffffffffed0->rc)->jointype =
                                       ((anon_struct_4_19_bb8b771d_for_fg *)
                                       &in_stack_fffffffffffffed0->rc)->jointype | bVar9;
                                  memset(pSVar7->a + local_c0,0,0x48);
                                }
                                local_a8->a[in_EDX].fg.jointype =
                                     local_a8->a[in_EDX].fg.jointype & 0x40;
                                local_a8->a[in_EDX].fg.jointype =
                                     local_a8->a[in_EDX].fg.jointype | bVar15 | bVar9;
                                if ((local_98->pOrderBy != (ExprList *)0x0) &&
                                   ((local_90->selFlags & 0x400000) == 0)) {
                                  in_stack_fffffffffffffec8 = (Parse *)local_98->pOrderBy;
                                  for (local_c0 = 0;
                                      local_c0 < *(int *)&in_stack_fffffffffffffec8->db;
                                      local_c0 = local_c0 + 1) {
                                    ((anon_union_4_2_6146edf4_for_u *)
                                    &in_stack_fffffffffffffec8->colNamesSet)[(long)local_c0 * 6].x.
                                    iOrderByCol = 0;
                                  }
                                  local_90->pOrderBy = (ExprList *)in_stack_fffffffffffffec8;
                                  local_98->pOrderBy = (ExprList *)0x0;
                                }
                                pEVar13 = local_98->pWhere;
                                local_98->pWhere = (Expr *)0x0;
                                if (local_bc != 0) {
                                  sqlite3SetJoinExpr((Expr *)in_stack_fffffffffffffec0,
                                                     in_stack_fffffffffffffebc,
                                                     in_stack_fffffffffffffeb8);
                                }
                                if (pEVar13 != (Expr *)0x0) {
                                  if (local_90->pWhere == (Expr *)0x0) {
                                    local_90->pWhere = pEVar13;
                                  }
                                  else {
                                    pEVar13 = sqlite3PExpr(in_stack_fffffffffffffed0,
                                                           (int)((ulong)in_stack_fffffffffffffec8 >>
                                                                0x20),
                                                           (Expr *)in_stack_fffffffffffffec0,
                                                           (Expr *)CONCAT44(
                                                  in_stack_fffffffffffffebc,
                                                  in_stack_fffffffffffffeb8));
                                    local_90->pWhere = pEVar13;
                                  }
                                }
                                if (*(char *)((long)&psVar5->xDlClose + 7) == '\0') {
                                  memset(local_60,0xaa,0x28);
                                  local_50 = local_bc;
                                  local_48 = local_98->pEList;
                                  local_58 = iVar2;
                                  local_54 = iVar3;
                                  local_40 = findLeftmostExprlist(local_98);
                                  substSelect((SubstContext *)in_stack_fffffffffffffee0,
                                              (Select *)
                                              CONCAT44(iVar10,CONCAT13(bVar15,CONCAT12(bVar9,
                                                  in_stack_fffffffffffffed8))),
                                              (int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
                                }
                                local_90->selFlags = local_98->selFlags & 0x100 | local_90->selFlags
                                ;
                                if (local_98->pLimit != (Expr *)0x0) {
                                  local_90->pLimit = local_98->pLimit;
                                  local_98->pLimit = (Expr *)0x0;
                                }
                                for (local_c0 = 0; local_c0 < iVar10; local_c0 = local_c0 + 1) {
                                  recomputeColumnsUsed
                                            ((Select *)
                                             CONCAT44(in_stack_fffffffffffffebc,
                                                      in_stack_fffffffffffffeb8),(SrcItem *)0x1e7f78
                                            );
                                }
                                local_98 = local_98->pPrior;
                              }
                              sqlite3AggInfoPersistWalkerInit
                                        ((Walker *)in_stack_fffffffffffffec0,
                                         (Parse *)CONCAT44(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8));
                              sqlite3WalkSelect((Walker *)in_stack_fffffffffffffec8,
                                                (Select *)in_stack_fffffffffffffec0);
                              sqlite3SelectDelete(in_stack_fffffffffffffec0,
                                                  (Select *)
                                                  CONCAT44(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8));
                              local_64 = 1;
                            }
                            else {
                              sqlite3SrcItemAttachSubquery
                                        ((Parse *)CONCAT44(in_stack_fffffffffffffedc,
                                                           CONCAT13(in_stack_fffffffffffffedb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeda,
                                                  in_stack_fffffffffffffed8))),
                                         (SrcItem *)in_stack_fffffffffffffed0,
                                         (Select *)in_stack_fffffffffffffec8,
                                         (int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
                              local_64 = 1;
                            }
                          }
                          else {
                            local_64 = 0;
                          }
                        }
                        else {
                          local_64 = 0;
                        }
                      }
                      else {
                        local_64 = 0;
                      }
                    }
                    else {
                      local_64 = 0;
                    }
                  }
                  else {
                    local_64 = 0;
                  }
                }
                else {
                  local_64 = 0;
                }
              }
              else {
                local_64 = 0;
              }
            }
            else {
              local_64 = 0;
            }
          }
          else {
            local_64 = 0;
          }
        }
        else {
          local_64 = 0;
        }
      }
      else {
        local_64 = 0;
      }
    }
    else {
      local_64 = 0;
    }
  }
  else {
    local_64 = 0;
  }
LAB_001e8001:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_64;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isOuterJoin = 0; /* True if pSub is the right side of a LEFT JOIN */
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  SrcItem *pSubitem;               /* The subquery */
  sqlite3 *db = pParse->db;
  Walker w;                        /* Walker to persist agginfo data */
  int *aCsrMap = 0;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  assert( pSubitem->fg.isSubquery );
  pSub = pSubitem->u4.pSubq->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & (JT_OUTER|JT_LTORJ))!=0 ){
    if( pSubSrc->nSrc>1                        /* (3a) */
     || IsVirtual(pSubSrc->a[0].pSTab)         /* (3b) */
     || (p->selFlags & SF_Distinct)!=0         /* (3d) */
     || (pSubitem->fg.jointype & JT_RIGHT)!=0  /* (26) */
    ){
      return 0;
    }
    isOuterJoin = 1;
  }

  assert( pSubSrc->nSrc>0 );  /* True by restriction (7) */
  if( iFrom>0 && (pSubSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
    return 0;   /* Restriction (27a) */
  }

  /* Condition (28) is blocked by the caller */
  assert( !pSubitem->fg.isCte || pSubitem->u2.pCteUse->eM10d!=M10d_Yes );

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    int ii;
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || isOuterJoin>0 ){
      return 0; /* (17d1), (17d2), or (17f) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( (pSub->selFlags & SF_Recursive)==0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
#ifndef SQLITE_OMIT_WINDOWFUNC
       || pSub1->pWin                                          /* (17e) */
#endif
      ){
        return 0;
      }
      if( iFrom>0 && (pSub1->pSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
        /* Without this restriction, the JT_LTORJ flag would end up being
        ** omitted on left-hand tables of the right join that is being
        ** flattened. */
        return 0;   /* Restrictions (17g), (27b) */
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }

    /* Restriction (23) */
    if( (p->selFlags & SF_Recursive) ) return 0;

    /* Restriction (17h) */
    if( compoundHasDifferentAffinities(pSub) ) return 0;

    if( pSrc->nSrc>1 ){
      if( pParse->nSelect>500 ) return 0;
      if( OptimizationDisabled(db, SQLITE_FlttnUnionAll) ) return 0;
      aCsrMap = sqlite3DbMallocZero(db, ((i64)pParse->nTab+1)*sizeof(int));
      if( aCsrMap ) aCsrMap[0] = pParse->nTab;
    }
  }

  /***** If we reach this point, flattening is permitted. *****/
  TREETRACE(0x4,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* Delete the transient structures associated with the subquery */

  if( ALWAYS(pSubitem->fg.isSubquery) ){
    pSub1 = sqlite3SubqueryDetach(db, pSubitem);
  }else{
    pSub1 = 0;
  }
  assert( pSubitem->fg.isSubquery==0 );
  assert( pSubitem->fg.fixedSchema==0 );
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  assert( pSubitem->fg.isUsing!=0 || pSubitem->u3.pOn==0 );

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause>
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    Table *pItemTab = pSubitem->pSTab;
    pSubitem->pSTab = 0;
    p->pOrderBy = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->op = TK_ALL;
    pSubitem->pSTab = pItemTab;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->selId = ++pParse->nSelect;
      if( aCsrMap && ALWAYS(db->mallocFailed==0) ){
        renumberCursors(pParse, pNew, iFrom, aCsrMap);
      }
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      TREETRACE(0x4,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    assert( pSubitem->fg.isSubquery==0 );
  }
  sqlite3DbFree(db, aCsrMap);
  if( db->mallocFailed ){
    assert( pSubitem->fg.fixedSchema==0 );
    assert( pSubitem->fg.isSubquery==0 );
    assert( pSubitem->u4.zDatabase==0 );
    sqlite3SrcItemAttachSubquery(pParse, pSubitem, pSub1, 0);
    return 1;
  }

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pSTab!=0) ){
    Table *pTabToDel = pSubitem->pSTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      sqlite3ParserAddCleanup(pToplevel, sqlite3DeleteTableGeneric, pTabToDel);
      testcase( pToplevel->earlyCleanup );
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pSTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  pSub = pSub1;
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    u8 ltorj = pSrc->a[iFrom].fg.jointype & JT_LTORJ;
    assert( pSub!=0 );
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pParent==p ){
      jointype = pSubitem->fg.jointype;     /* First time through the loop */
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    iNewParent = pSubSrc->a[0].iCursor;
    for(i=0; i<nSubSrc; i++){
      SrcItem *pItem = &pSrc->a[i+iFrom];
      assert( pItem->fg.isTabFunc==0 );
      assert( pItem->fg.isSubquery
           || pItem->fg.fixedSchema
           || pItem->u4.zDatabase==0 );
      if( pItem->fg.isUsing ) sqlite3IdListDelete(db, pItem->u3.pUsing);
      *pItem = pSubSrc->a[i];
      pItem->fg.jointype |= ltorj;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype &= JT_LTORJ;
    pSrc->a[iFrom].fg.jointype |= jointype | ltorj;

    /* Now begin substituting subquery result set expressions for
    ** references to the iParent in the outer query.
    **
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy && (pParent->selFlags & SF_NoopOrderBy)==0 ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transferring the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isOuterJoin>0 ){
      assert( pSubSrc->nSrc==1 );
      sqlite3SetJoinExpr(pWhere, iNewParent, EP_OuterON);
    }
    if( pWhere ){
      if( pParent->pWhere ){
        pParent->pWhere = sqlite3PExpr(pParse, TK_AND, pWhere, pParent->pWhere);
      }else{
        pParent->pWhere = pWhere;
      }
    }
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isOuterJoin = isOuterJoin;
      x.pEList = pSub->pEList;
      x.pCList = findLeftmostExprlist(pSub);
      substSelect(&x, pParent, 0);
    }

    /* The flattened query is a compound if either the inner or the
    ** outer query is a compound. */
    pParent->selFlags |= pSub->selFlags & SF_Compound;
    assert( (pSub->selFlags & SF_Distinct)==0 ); /* restriction (17b) */

    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }

    /* Recompute the SrcItem.colUsed masks for the flattened
    ** tables. */
    for(i=0; i<nSubSrc; i++){
      recomputeColumnsUsed(pParent, &pSrc->a[i+iFrom]);
    }
  }

  /* Finally, delete what is left of the subquery and return success.
  */
  sqlite3AggInfoPersistWalkerInit(&w, pParse);
  sqlite3WalkSelect(&w,pSub1);
  sqlite3SelectDelete(db, pSub1);

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x4 ){
    TREETRACE(0x4,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}